

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_icdf<trng::twosided_exponential_dist<double>>
               (twosided_exponential_dist<double> *d)

{
  long lVar1;
  double dVar2;
  result_type_conflict2 rVar3;
  pointer pdVar4;
  ulong uVar5;
  int i;
  int iVar6;
  pointer pdVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<double,_std::allocator<double>_> p_values;
  double eps;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> local_118;
  undefined1 local_f8 [16];
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  undefined8 *local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  local_e0 = 5.6843418860808015e-14;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_78.m_assertionInfo.macroName.m_start = (char *)0x3fe0000000000000;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_118,(iterator)0x0,(double *)&local_78);
  iVar6 = 2;
  do {
    local_f8._0_8_ = (double)iVar6;
    dVar2 = pow(*local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(double)iVar6);
    local_78.m_assertionInfo.macroName.m_start = (char *)(dVar2 + 0.0);
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_118,
                 (iterator)
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_78);
    }
    else {
      *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_78.m_assertionInfo.macroName.m_start;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    dVar2 = pow(*local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(double)local_f8._0_8_);
    local_78.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar2);
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_118,
                 (iterator)
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_78);
    }
    else {
      *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_78.m_assertionInfo.macroName.m_start;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    pdVar7 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar4 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x35);
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,pdVar7);
    pdVar4 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar7 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_f8._0_8_ = *pdVar7;
        rVar3 = trng::twosided_exponential_dist<double>::icdf(d,*pdVar7);
        rVar3 = trng::twosided_exponential_dist<double>::cdf(d,rVar3);
        uVar5 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
        if (5.6843418860808015e-14 <= ABS(rVar3 - (double)local_f8._0_8_)) {
          local_f8._8_4_ = (int)uVar5;
          local_f8._0_8_ = ABS(rVar3 - (double)local_f8._0_8_);
          local_f8._12_4_ = (int)(uVar5 >> 0x20);
          local_b8._vptr_ITransientExpression = (_func_int **)0x2a6457;
          local_b8.m_isBinaryExpression = true;
          local_b8.m_result = false;
          local_b8._10_6_ = 0;
          local_c8.file =
               "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
          ;
          local_c8.line = 0xa8;
          Catch::StringRef::StringRef(&local_88,"std::abs(y - p) < eps");
          Catch::AssertionHandler::AssertionHandler
                    (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
          local_d0 = local_f8._0_8_;
          local_d8 = local_e0;
          Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
          local_b8.m_result = (double)local_f8._0_8_ < local_d8;
          local_b8.m_isBinaryExpression = true;
          local_b8._vptr_ITransientExpression =
               (_func_int **)&PTR_streamReconstructedExpression_003182f8;
          local_a8 = &local_d0;
          local_a0 = local_c8.file;
          sStack_98 = local_c8.line;
          local_90 = &local_e0;
          Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
          Catch::ITransientExpression::~ITransientExpression(&local_b8);
          Catch::AssertionHandler::complete(&local_78);
          if (local_78.m_completed == false) {
            (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                      (local_78.m_resultCapture,&local_78);
          }
        }
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != pdVar4);
    }
  }
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}